

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::setControlLowerBound
          (OptimalControlProblem *this,VectorDynSize *minControl)

{
  OptimalControlProblemPimpl *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TimeInvariantObject<iDynTree::VectorDynSize> *pTVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  undefined1 local_29;
  TimeInvariantObject<iDynTree::VectorDynSize> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if ((this->m_pimpl->dynamicalSystem).
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    pcVar6 = "First a dynamical system has to be set.";
  }
  else {
    sVar4 = iDynTree::VectorDynSize::size();
    sVar5 = DynamicalSystem::controlSpaceSize
                      ((this->m_pimpl->dynamicalSystem).
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar4 == sVar5) {
      this->m_pimpl->controlLowerBounded = true;
      local_28 = (TimeInvariantObject<iDynTree::VectorDynSize> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,std::allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>>,iDynTree::VectorDynSize_const&>
                (&_Stack_20,&local_28,
                 (allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>
                  *)&local_29,minControl);
      _Var3._M_pi = _Stack_20._M_pi;
      pTVar2 = local_28;
      pOVar1 = this->m_pimpl;
      local_28 = (TimeInvariantObject<iDynTree::VectorDynSize> *)0x0;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (pOVar1->controlLowerBound).
                super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      (pOVar1->controlLowerBound).
      super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = &pTVar2->super_TimeVaryingObject<iDynTree::VectorDynSize>;
      (pOVar1->controlLowerBound).
      super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var3._M_pi;
      if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
         _Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      }
      return true;
    }
    pcVar6 = "The dimension of minControl does not coincide with the control dimension.";
  }
  iDynTree::reportError("OptimalControlProblem","setControlLowerBound",pcVar6);
  return false;
}

Assistant:

bool OptimalControlProblem::setControlLowerBound(const VectorDynSize &minControl)
        {
            if (!(m_pimpl->dynamicalSystem)){
                reportError("OptimalControlProblem", "setControlLowerBound", "First a dynamical system has to be set.");
                return false;
            }

            if (minControl.size() != m_pimpl->dynamicalSystem->controlSpaceSize()) {
                reportError("OptimalControlProblem", "setControlLowerBound", "The dimension of minControl does not coincide with the control dimension.");
                return false;
            }

            m_pimpl->controlLowerBounded = true;
            m_pimpl->controlLowerBound = std::make_shared<TimeInvariantVector>(minControl);

            return true;
        }